

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O0

void plutovg_rasterize(plutovg_span_buffer_t *span_buffer,plutovg_path_t *path,
                      plutovg_matrix_t *matrix,plutovg_rect_t *clip_rect,
                      plutovg_stroke_data_t *stroke_data,plutovg_fill_rule_t winding)

{
  undefined1 local_80 [8];
  PVG_FT_Raster_Params params;
  PVG_FT_Outline *outline;
  plutovg_fill_rule_t winding_local;
  plutovg_stroke_data_t *stroke_data_local;
  plutovg_rect_t *clip_rect_local;
  plutovg_matrix_t *matrix_local;
  plutovg_path_t *path_local;
  plutovg_span_buffer_t *span_buffer_local;
  
  local_80 = (undefined1  [8])ft_outline_convert(path,matrix,stroke_data);
  if (stroke_data == (plutovg_stroke_data_t *)0x0) {
    if (winding == PLUTOVG_FILL_RULE_EVEN_ODD) {
      ((PVG_FT_Outline *)local_80)->flags = 2;
    }
    else {
      ((PVG_FT_Outline *)local_80)->flags = 0;
    }
  }
  else {
    ((PVG_FT_Outline *)local_80)->flags = 0;
  }
  params.source._0_4_ = 3;
  params._8_8_ = spans_generation_callback;
  if (clip_rect != (plutovg_rect_t *)0x0) {
    params.source._0_4_ = 7;
    params.user = (void *)(long)clip_rect->x;
    params.clip_box.xMin = (PVG_FT_Pos)clip_rect->y;
    params.clip_box.yMin = (PVG_FT_Pos)(clip_rect->x + clip_rect->w);
    params.clip_box.xMax = (PVG_FT_Pos)(clip_rect->y + clip_rect->h);
  }
  params.gray_spans = (PVG_FT_SpanFunc)span_buffer;
  params.clip_box.yMax = (PVG_FT_Pos)local_80;
  plutovg_span_buffer_reset(span_buffer);
  PVG_FT_Raster_Render((PVG_FT_Raster_Params *)local_80);
  ft_outline_destroy((PVG_FT_Outline *)params.clip_box.yMax);
  return;
}

Assistant:

void plutovg_rasterize(plutovg_span_buffer_t* span_buffer, const plutovg_path_t* path, const plutovg_matrix_t* matrix, const plutovg_rect_t* clip_rect, const plutovg_stroke_data_t* stroke_data, plutovg_fill_rule_t winding)
{
    PVG_FT_Outline* outline = ft_outline_convert(path, matrix, stroke_data);
    if(stroke_data) {
        outline->flags = PVG_FT_OUTLINE_NONE;
    } else {
        switch(winding) {
        case PLUTOVG_FILL_RULE_EVEN_ODD:
            outline->flags = PVG_FT_OUTLINE_EVEN_ODD_FILL;
            break;
        default:
            outline->flags = PVG_FT_OUTLINE_NONE;
            break;
        }
    }

    PVG_FT_Raster_Params params;
    params.flags = PVG_FT_RASTER_FLAG_DIRECT | PVG_FT_RASTER_FLAG_AA;
    params.gray_spans = spans_generation_callback;
    params.user = span_buffer;
    params.source = outline;
    if(clip_rect) {
        params.flags |= PVG_FT_RASTER_FLAG_CLIP;
        params.clip_box.xMin = (PVG_FT_Pos)clip_rect->x;
        params.clip_box.yMin = (PVG_FT_Pos)clip_rect->y;
        params.clip_box.xMax = (PVG_FT_Pos)(clip_rect->x + clip_rect->w);
        params.clip_box.yMax = (PVG_FT_Pos)(clip_rect->y + clip_rect->h);
    }

    plutovg_span_buffer_reset(span_buffer);
    PVG_FT_Raster_Render(&params);
    ft_outline_destroy(outline);
}